

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_csv_relation.cpp
# Opt level: O3

void __thiscall
duckdb::WriteCSVRelation::WriteCSVRelation
          (WriteCSVRelation *this,shared_ptr<duckdb::Relation,_true> *child_p,string *csv_file_p,
          case_insensitive_map_t<vector<Value>_> *options_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 uVar6;
  Relation *pRVar7;
  string local_50;
  
  pRVar7 = shared_ptr<duckdb::Relation,_true>::operator->(child_p);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,anon_var_dwarf_4ed193b + 9);
  Relation::Relation(&this->super_Relation,&pRVar7->context,WRITE_CSV_RELATION,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_Relation)._vptr_Relation = (_func_int **)&PTR__WriteCSVRelation_02462a00;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var5 = (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar4;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  paVar2 = &(this->csv_file).field_2;
  (this->csv_file)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (csv_file_p->_M_dataplus)._M_p;
  paVar1 = &csv_file_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar6 = *(undefined8 *)((long)&csv_file_p->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->csv_file).field_2 + 8) = uVar6;
  }
  else {
    (this->csv_file)._M_dataplus._M_p = pcVar3;
    (this->csv_file).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->csv_file)._M_string_length = csv_file_p->_M_string_length;
  (csv_file_p->_M_dataplus)._M_p = (pointer)paVar1;
  csv_file_p->_M_string_length = 0;
  (csv_file_p->field_2)._M_local_buf[0] = '\0';
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->options)._M_h,options_p,options_p);
  Relation::TryBindRelation(&this->super_Relation,&this->columns);
  return;
}

Assistant:

WriteCSVRelation::WriteCSVRelation(shared_ptr<Relation> child_p, string csv_file_p,
                                   case_insensitive_map_t<vector<Value>> options_p)
    : Relation(child_p->context, RelationType::WRITE_CSV_RELATION), child(std::move(child_p)),
      csv_file(std::move(csv_file_p)), options(std::move(options_p)) {
	TryBindRelation(columns);
}